

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateManager.cpp
# Opt level: O1

string * __thiscall
helics::ValueFederateManager::getTarget_abi_cxx11_(ValueFederateManager *this,Input *inp)

{
  bool bVar1;
  int iVar2;
  _Base_ptr p_Var3;
  string *psVar4;
  _Base_ptr p_Var5;
  _Rb_tree_header *p_Var6;
  pthread_rwlock_t *__rwlock;
  
  bVar1 = (this->inputTargets).enabled;
  if (bVar1 == true) {
    __rwlock = (pthread_rwlock_t *)&(this->inputTargets).m_mutex;
    std::__shared_mutex_pthread::lock_shared((__shared_mutex_pthread *)&__rwlock->__data);
  }
  else {
    __rwlock = (pthread_rwlock_t *)0x0;
  }
  p_Var5 = (this->inputTargets).m_obj._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var6 = &(this->inputTargets).m_obj._M_t._M_impl.super__Rb_tree_header;
  p_Var3 = &p_Var6->_M_header;
  if (p_Var5 != (_Base_ptr)0x0) {
    iVar2 = (inp->super_Interface).handle.hid;
    do {
      if (iVar2 <= (int)p_Var5[1]._M_color) {
        p_Var3 = p_Var5;
      }
      p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < iVar2];
    } while (p_Var5 != (_Base_ptr)0x0);
  }
  p_Var5 = &p_Var6->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var6) &&
     (p_Var5 = p_Var3, (inp->super_Interface).handle.hid < (int)p_Var3[1]._M_color)) {
    p_Var5 = &p_Var6->_M_header;
  }
  if (bVar1 != false) {
    pthread_rwlock_unlock(__rwlock);
  }
  psVar4 = (string *)emptyStr_abi_cxx11_;
  if ((_Rb_tree_header *)p_Var5 != p_Var6) {
    psVar4 = (string *)&p_Var5[1]._M_parent;
  }
  return psVar4;
}

Assistant:

const std::string& ValueFederateManager::getTarget(const Input& inp) const
{
    auto inpHandle = inputTargets.lock_shared();
    auto fnd = inpHandle->find(inp.handle);
    if (fnd != inpHandle->end()) {
        return fnd->second;
    }
    return emptyStr;
}